

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O3

RequestBuilder * __thiscall
restincurl::RequestBuilder::StoreData<std::__cxx11::string>
          (RequestBuilder *this,
          InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dh)

{
  InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  CURLoption local_1c;
  
  if (this->is_built_ != true) {
    local_28 = (InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(local_28._4_4_,0x4e2b);
    Options::Set<unsigned_long(char*,unsigned_long,unsigned_long,void*)>
              ((this->options_)._M_t.
               super___uniq_ptr_impl<restincurl::Options,_std::default_delete<restincurl::Options>_>
               ._M_t.
               super__Tuple_impl<0UL,_restincurl::Options_*,_std::default_delete<restincurl::Options>_>
               .super__Head_base<0UL,_restincurl::Options_*,_false>._M_head_impl,
               (CURLoption *)&local_28,
               InDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::write_callback);
    local_1c = CURLOPT_WRITEDATA;
    local_28 = dh;
    Options::Set<restincurl::InDataHandler<std::__cxx11::string>*>
              ((this->options_)._M_t.
               super___uniq_ptr_impl<restincurl::Options,_std::default_delete<restincurl::Options>_>
               ._M_t.
               super__Tuple_impl<0UL,_restincurl::Options_*,_std::default_delete<restincurl::Options>_>
               .super__Head_base<0UL,_restincurl::Options_*,_false>._M_head_impl,&local_1c,&local_28
              );
    this->have_data_in_ = true;
    return this;
  }
  __assert_fail("!is_built_",
                "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                ,0x5b3,
                "RequestBuilder &restincurl::RequestBuilder::StoreData(InDataHandler<T> &) [T = std::basic_string<char>]"
               );
}

Assistant:

RequestBuilder& StoreData(InDataHandler<T>& dh) {
            assert(!is_built_);
            options_->Set(CURLOPT_WRITEFUNCTION, dh.write_callback);
            options_->Set(CURLOPT_WRITEDATA, &dh);
            have_data_in_ = true;
            return *this;
        }